

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.h
# Opt level: O2

int __thiscall libchess::Position::see_to(Position *this,Square square,array<int,_6UL> piece_values)

{
  array<int,_6UL> piece_values_00;
  int iVar1;
  optional<libchess::Move> oVar2;
  optional<libchess::Piece> oVar3;
  array<int,_6UL> *paVar4;
  reference pvVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Position pos;
  Position local_b8;
  
  oVar2 = smallest_capture_move_to(this,square);
  iVar6 = 0;
  if (((ulong)oVar2.super__Optional_base<libchess::Move,_true,_true>._M_payload.
              super__Optional_payload_base<libchess::Move> >> 0x20 & 1) != 0) {
    uVar7 = (uint)oVar2.super__Optional_base<libchess::Move,_true,_true>._M_payload.
                  super__Optional_payload_base<libchess::Move>._M_payload & 0x38000;
    oVar3 = piece_on(this,square);
    iVar6 = 0;
    if (uVar7 == 0x18000 ||
        ((ulong)oVar3.super__Optional_base<libchess::Piece,_true,_true>._M_payload.
                super__Optional_payload_base<libchess::Piece> & 0x100000000) != 0) {
      paVar4 = &piece_values;
      if (uVar7 != 0x18000) {
        paVar4 = (array<int,_6UL> *)
                 std::array<int,_6UL>::at
                           (&piece_values,
                            (ulong)((uint)oVar3.super__Optional_base<libchess::Piece,_true,_true>.
                                          _M_payload.super__Optional_payload_base<libchess::Piece>.
                                          _M_payload & 7));
      }
      iVar8 = paVar4->_M_elems[0];
      uVar7 = (uint)((ulong)oVar2.super__Optional_base<libchess::Move,_true,_true>._M_payload.
                            super__Optional_payload_base<libchess::Move> >> 0xc) & 7;
      if ((((ulong)oVar2.super__Optional_base<libchess::Move,_true,_true>._M_payload.
                   super__Optional_payload_base<libchess::Move> >> 0xc & 7) != 0) && (uVar7 != 5)) {
        pvVar5 = std::array<int,_6UL>::at(&piece_values,(ulong)uVar7);
        iVar8 = (iVar8 + *pvVar5) - piece_values._M_elems[0];
      }
      Position(&local_b8,this);
      make_move(&local_b8,
                oVar2.super__Optional_base<libchess::Move,_true,_true>._M_payload.
                super__Optional_payload_base<libchess::Move>._M_payload._M_value);
      piece_values_00._M_elems[1] = piece_values._M_elems[1];
      piece_values_00._M_elems[0] = piece_values._M_elems[0];
      piece_values_00._M_elems[2] = piece_values._M_elems[2];
      piece_values_00._M_elems[3] = piece_values._M_elems[3];
      piece_values_00._M_elems[4] = piece_values._M_elems[4];
      piece_values_00._M_elems[5] = piece_values._M_elems[5];
      iVar1 = see_to(&local_b8,square,piece_values_00);
      iVar6 = 0;
      if (0 < iVar8 - iVar1) {
        iVar6 = iVar8 - iVar1;
      }
      ~Position(&local_b8);
    }
  }
  return iVar6;
}

Assistant:

inline int Position::see_to(Square square, std::array<int, 6> piece_values) {
    auto smallest_capture_move = smallest_capture_move_to(square);
    if (!smallest_capture_move) {
        return 0;
    }
    bool is_enpassant = smallest_capture_move->type() == Move::Type::ENPASSANT;

    auto square_pt = piece_on(square);
    if (!square_pt && !is_enpassant) {
        return 0;
    }

    int piece_val = is_enpassant ? piece_values.at(0) : piece_values.at(square_pt->type().value());
    auto smallest_capture_move_prom_piece_type = smallest_capture_move->promotion_piece_type();
    if (smallest_capture_move_prom_piece_type) {
        piece_val +=
            piece_values.at(smallest_capture_move_prom_piece_type->value()) - piece_values.at(0);
    }
    Position pos = *this;
    pos.make_move(*smallest_capture_move);
    return std::max(0, piece_val - pos.see_to(square, piece_values));
}